

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandQueueVkImpl.hpp
# Opt level: O2

SyncPointVkPtr __thiscall Diligent::CommandQueueVkImpl::GetLastSyncPoint(CommandQueueVkImpl *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  SyncPointVkPtr SVar1;
  
  Threading::SpinLock::lock((SpinLock *)(in_RSI + 0x80));
  std::__shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 0x88));
  Threading::SpinLock::unlock((SpinLock *)(in_RSI + 0x80));
  SVar1.super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  SVar1.super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (SyncPointVkPtr)SVar1.super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

SyncPointVkPtr GetLastSyncPoint()
    {
        Threading::SpinLockGuard Guard{m_LastSyncPointLock};
        return m_LastSyncPoint;
    }